

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Solver::ccMinimize
          (Solver *this,LitVec *cc,LitVec *removed,uint32 antes,CCMinRecursive *ccMin)

{
  uint32 uVar1;
  bool bVar2;
  pointer pLVar3;
  uint uVar4;
  uint32 uVar5;
  ulong uVar6;
  uint uVar7;
  size_type i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (ccMin != (CCMinRecursive *)0x0) {
    ccMinRecurseInit(this,ccMin);
  }
  uVar6 = 1;
  uVar7 = 0;
  uVar5 = 0;
  uVar8 = 1;
  uVar9 = 1;
  do {
    pLVar3 = (cc->ebo_).buf;
    if ((size_type)uVar8 == (cc->ebo_).size) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
                (cc,pLVar3 + uVar9,pLVar3 + uVar8);
      if ((int)uVar6 != 1) {
        pLVar3 = (cc->ebo_).buf;
        uVar1 = pLVar3[1].rep_;
        pLVar3[1].rep_ = pLVar3[uVar6].rep_;
        pLVar3[uVar6].rep_ = uVar1;
      }
      return uVar5;
    }
    if (antes == 3) {
LAB_00164c5d:
      uVar4 = *(uint *)((long)(this->assign_).assign_.ebo_.buf +
                       (ulong)(pLVar3[uVar8].rep_ & 0xfffffffc)) >> 4;
      bVar2 = uVar4 < uVar7;
      if (uVar7 < uVar4) {
        uVar5 = 0;
        uVar6 = uVar9;
        uVar7 = uVar4;
      }
      uVar5 = (uVar5 + 1) - (uint)bVar2;
      uVar10 = (ulong)((int)uVar9 + 1);
      pLVar3[uVar9].rep_ = pLVar3[uVar8].rep_;
    }
    else {
      bVar2 = ccRemovable(this,(Literal)(pLVar3[uVar8].rep_ & 0xfffffffe ^ 2),antes,ccMin);
      pLVar3 = (cc->ebo_).buf;
      if (!bVar2) goto LAB_00164c5d;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (removed,pLVar3 + uVar8);
      uVar10 = uVar9;
    }
    uVar8 = (ulong)((size_type)uVar8 + 1);
    uVar9 = uVar10;
  } while( true );
}

Assistant:

uint32 Solver::ccMinimize(LitVec& cc, LitVec& removed, uint32 antes, CCMinRecursive* ccMin) {
	if (ccMin) { ccMinRecurseInit(*ccMin); }
	// skip the asserting literal
	LitVec::size_type j = 1;
	uint32 assertLevel  = 0;
	uint32 assertPos    = 1;
	uint32 onAssert     = 0;
	uint32 varLevel     = 0;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		if (antes == SolverStrategies::no_antes || !ccRemovable(~cc[i], antes, ccMin)) {
			if ( (varLevel = level(cc[i].var())) > assertLevel ) {
				assertLevel = varLevel;
				assertPos   = static_cast<uint32>(j);
				onAssert    = 0;
			}
			onAssert += (varLevel == assertLevel);
			cc[j++] = cc[i];
		}
		else {
			removed.push_back(cc[i]);
		}
	}
	cc.erase(cc.begin()+j, cc.end());
	if (assertPos != 1) {
		std::swap(cc[1], cc[assertPos]);
	}
	return onAssert;
}